

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::TypeofElem(Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  RecyclableObject *scriptContext_00;
  Var pvVar3;
  bool bVar4;
  BOOL BVar5;
  PropertyId PVar6;
  JavascriptString *varName;
  ThreadContext *this;
  JavascriptLibrary *pJVar7;
  undefined4 *puVar8;
  JavascriptException *err;
  PropertyRecord *debugPropertyRecord;
  JavascriptString *indexStr;
  IndexType local_78;
  IndexType indexType;
  undefined1 local_68 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  PropertyRecord *propertyRecord;
  Var pvStack_38;
  uint32 indexVal;
  Var member;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var index_local;
  Var instance_local;
  
  member = (Var)0x0;
  object = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)index;
  index_local = instance;
  BVar5 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&member);
  scriptContext_00 = object;
  if (BVar5 == 0) {
    varName = GetPropertyDisplayNameForError(scriptContext_local,(ScriptContext *)object);
    JavascriptError::ThrowTypeError((ScriptContext *)scriptContext_00,-0x7ff5ec48,varName);
  }
  pvStack_38 = (Var)0x0;
  threadContext = (ThreadContext *)0x0;
  this = ScriptContext::GetThreadContext((ScriptContext *)object);
  autoCatchHandlerExists.m_threadContext._7_1_ = ThreadContext::GetImplicitCallFlags(this);
  ThreadContext::ClearImplicitCallFlags(this);
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_68,(ScriptContext *)object,true);
  local_78 = GetIndexType(&scriptContext_local,(ScriptContext *)object,
                          (uint32 *)((long)&propertyRecord + 4),(PropertyRecord **)&threadContext,
                          false);
  if (local_78 == IndexType_Number) {
    BVar5 = GetItem(index_local,(RecyclableObject *)member,propertyRecord._4_4_,
                    &stack0xffffffffffffffc8,(ScriptContext *)object);
    if (BVar5 == 0) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
      ThreadContext::AddImplicitCallFlags(this,autoCatchHandlerExists.m_threadContext._7_1_);
      pJVar7 = ScriptContext::GetLibrary((ScriptContext *)object);
      instance_local = JavascriptLibrary::GetUndefinedDisplayString(pJVar7);
      goto LAB_00f8ce69;
    }
  }
  else {
    if (local_78 != IndexType_PropertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1e4,"(indexType == IndexType_PropertyId)",
                                  "indexType == IndexType_PropertyId");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if ((threadContext == (ThreadContext *)0x0) &&
       (bVar4 = CanShortcutOnUnknownPropertyName((RecyclableObject *)member), !bVar4)) {
      local_78 = GetIndexTypeFromPrimitive
                           (scriptContext_local,(ScriptContext *)object,
                            (uint32 *)((long)&propertyRecord + 4),(PropertyRecord **)&threadContext,
                            true);
      if (local_78 != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1e8,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (threadContext == (ThreadContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1e9,"(propertyRecord != nullptr)","propertyRecord != nullptr"
                                   );
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    pvVar3 = index_local;
    pvVar2 = member;
    if (threadContext == (ThreadContext *)0x0) {
      debugPropertyRecord =
           (PropertyRecord *)
           JavascriptConversion::ToString(scriptContext_local,(ScriptContext *)object);
      ScriptContext::GetOrAddPropertyRecord
                ((ScriptContext *)object,(JavascriptString *)debugPropertyRecord,
                 (PropertyRecord **)&err);
      pvVar3 = index_local;
      pvVar2 = member;
      PVar6 = PropertyRecord::GetPropertyId((PropertyRecord *)err);
      BVar5 = GetProperty(pvVar3,(RecyclableObject *)pvVar2,PVar6,&stack0xffffffffffffffc8,
                          (ScriptContext *)object,(PropertyValueInfo *)0x0);
      if (BVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1fc,
                                    "(!JavascriptOperators::GetProperty(instance, object, debugPropertyRecord->GetPropertyId(), &member, scriptContext))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
      ThreadContext::AddImplicitCallFlags(this,autoCatchHandlerExists.m_threadContext._7_1_);
      pJVar7 = ScriptContext::GetLibrary((ScriptContext *)object);
      instance_local = JavascriptLibrary::GetUndefinedDisplayString(pJVar7);
      goto LAB_00f8ce69;
    }
    PVar6 = PropertyRecord::GetPropertyId((PropertyRecord *)threadContext);
    BVar5 = GetProperty(pvVar3,(RecyclableObject *)pvVar2,PVar6,&stack0xffffffffffffffc8,
                        (ScriptContext *)object,(PropertyValueInfo *)0x0);
    if (BVar5 == 0) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
      ThreadContext::AddImplicitCallFlags(this,autoCatchHandlerExists.m_threadContext._7_1_);
      pJVar7 = ScriptContext::GetLibrary((ScriptContext *)object);
      instance_local = JavascriptLibrary::GetUndefinedDisplayString(pJVar7);
      goto LAB_00f8ce69;
    }
  }
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
  ThreadContext::AddImplicitCallFlags(this,autoCatchHandlerExists.m_threadContext._7_1_);
  instance_local = Typeof(pvStack_38,(ScriptContext *)object);
LAB_00f8ce69:
  indexStr._4_4_ = 1;
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_68);
  return instance_local;
}

Assistant:

Var JavascriptOperators::TypeofElem(Var instance, Var index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofElem);
        RecyclableObject* object = nullptr;

        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined, GetPropertyDisplayNameForError(index, scriptContext));
        }

        Var member = nullptr;
        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;

        ThreadContext* threadContext = scriptContext->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        try
        {
            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
            IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

            // For JS Objects, don't create the propertyId if not already added
            if (indexType == IndexType_Number)
            {
                // In edge mode, we don't need to worry about the special "unknown" behavior. If the item is not available from Get,
                // just return undefined.
                if (!JavascriptOperators::GetItem(instance, object, indexVal, &member, scriptContext))
                {
                    // If the instance doesn't have the item, typeof result is "undefined".
                    threadContext->CheckAndResetImplicitCallAccessorFlag();
                    threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                    return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                }
            }
            else
            {
                Assert(indexType == IndexType_PropertyId);
                if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
                {
                    indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                    Assert(indexType == IndexType_PropertyId);
                    Assert(propertyRecord != nullptr);
                }

                if (propertyRecord != nullptr)
                {
                    if (!JavascriptOperators::GetProperty(instance, object, propertyRecord->GetPropertyId(), &member, scriptContext))
                    {
                        // If the instance doesn't have the property, typeof result is "undefined".
                        threadContext->CheckAndResetImplicitCallAccessorFlag();
                        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                        return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                    }
                }
                else
                {
#if DBG
                    JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                    PropertyRecord const * debugPropertyRecord;
                    scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                    AssertMsg(!JavascriptOperators::GetProperty(instance, object, debugPropertyRecord->GetPropertyId(), &member, scriptContext), "how did this property come? See OS Bug 2727708 if you see this come from the web");
#endif

                    // If the instance doesn't have the property, typeof result is "undefined".
                    threadContext->CheckAndResetImplicitCallAccessorFlag();
                    threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                    return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                }
            }
            threadContext->CheckAndResetImplicitCallAccessorFlag();
            threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
            return JavascriptOperators::Typeof(member, scriptContext);
        }
        catch(const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            threadContext->CheckAndResetImplicitCallAccessorFlag();
            threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        JIT_HELPER_END(Op_TypeofElem);
    }